

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  VkSampleLocationEXT *pVVar6;
  undefined8 *puVar7;
  void *pvVar8;
  byte bVar9;
  size_t size;
  
  if ((create_info->sampleLocationsInfo).pNext != (void *)0x0) {
    return (void *)0x0;
  }
  if (dynamic_state_info == (DynamicStateInfo *)0x0) {
    bVar9 = 0;
  }
  else {
    bVar9 = dynamic_state_info->sample_locations_enable;
  }
  puVar7 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
  if (puVar7 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    uVar3 = *(undefined8 *)&create_info->sampleLocationsEnable;
    uVar4 = *(undefined8 *)&create_info->sampleLocationsInfo;
    pvVar8 = (create_info->sampleLocationsInfo).pNext;
    uVar5 = *(undefined8 *)&(create_info->sampleLocationsInfo).sampleLocationsPerPixel;
    pVVar6 = (create_info->sampleLocationsInfo).pSampleLocations;
    puVar7[6] = *(undefined8 *)&(create_info->sampleLocationsInfo).sampleLocationGridSize.height;
    puVar7[7] = pVVar6;
    puVar7[4] = pvVar8;
    puVar7[5] = uVar5;
    puVar7[2] = uVar3;
    puVar7[3] = uVar4;
    *puVar7 = uVar2;
    puVar7[1] = pvVar1;
  }
  if (((dynamic_state_info == (DynamicStateInfo *)0x0) ||
      (dynamic_state_info->sample_locations != false)) ||
     (*(int *)(puVar7 + 2) == 0 && (bVar9 & 1) == 0)) {
    *(undefined4 *)(puVar7 + 3) = 0x3b9cf898;
    *(undefined8 *)((long)puVar7 + 0x1c) = 0;
    *(undefined8 *)((long)puVar7 + 0x24) = 0;
    *(undefined8 *)((long)puVar7 + 0x2c) = 0;
    *(undefined8 *)((long)puVar7 + 0x34) = 0;
    *(undefined4 *)((long)puVar7 + 0x3c) = 0;
    return puVar7;
  }
  if ((ulong)*(uint *)((long)puVar7 + 0x34) != 0) {
    pvVar1 = (void *)puVar7[7];
    size = (ulong)*(uint *)((long)puVar7 + 0x34) << 3;
    pvVar8 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar8 != (void *)0x0) {
      memmove(pvVar8,pvVar1,size);
      goto LAB_001250c7;
    }
  }
  pvVar8 = (void *)0x0;
LAB_001250c7:
  puVar7[7] = pvVar8;
  return puVar7;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	// This is only a thing for VkImageMemoryBarrier pNext.
	if (create_info->sampleLocationsInfo.pNext)
		return nullptr;

	bool dynamic_enable = dynamic_state_info && dynamic_state_info->sample_locations_enable;
	auto *sample_locations = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->sample_locations &&
	    (sample_locations->sampleLocationsEnable || dynamic_enable))
	{
		sample_locations->sampleLocationsInfo.pSampleLocations =
				copy(sample_locations->sampleLocationsInfo.pSampleLocations,
				     sample_locations->sampleLocationsInfo.sampleLocationsCount, alloc);
	}
	else
	{
		// Otherwise, ignore the location info.
		// Either it's dynamic, or ignored due to sampleLocationsEnable being VK_FALSE.
		sample_locations->sampleLocationsInfo = { VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT };
	}

	return sample_locations;
}